

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O3

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  long lVar1;
  ResScalar *res;
  double dVar2;
  uint uVar3;
  RhsScalar *pRVar4;
  ulong cols_00;
  LhsScalar *pLVar5;
  ulong uVar6;
  undefined8 *puVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  size_t __size;
  double *pdVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  double dStack_1a8;
  long local_1a0;
  ulong local_198;
  long local_190;
  long local_188;
  long local_180;
  ulong local_178;
  long local_170;
  long local_168;
  RhsScalar *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  ulong local_138;
  double *local_130;
  long local_128;
  double *local_120;
  double *local_118;
  ulong local_110;
  ulong local_108;
  int local_fc;
  long lStack_f8;
  int l1;
  double *local_f0;
  long local_e8;
  ulong local_e0;
  long local_d8;
  double *local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  RhsScalar *local_b0;
  RhsScalar *local_a8;
  LhsScalar *local_a0;
  RhsScalar *local_98;
  RhsScalar *local_90;
  uint local_88;
  uint local_84;
  int l2;
  int l3;
  long local_78;
  RhsScalar local_70;
  long cols;
  LhsScalar *local_60;
  ulong local_58;
  ulong local_50;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar9 = &dStack_1a8;
  local_d8 = triStride;
  local_148 = _tri;
  local_70 = (RhsScalar)otherSize;
  local_58 = size;
  lVar15 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar15 = size;
  }
  uVar20 = lVar15 * blocking->m_kc;
  if (uVar20 >> 0x3d != 0) {
LAB_0010fa65:
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = operator_delete;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_60 = blocking->m_blockA;
  local_c8 = lVar15;
  local_50 = blocking->m_kc;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar20 < 0x4001) {
      pdVar9 = (double *)((long)&dStack_1a8 - (uVar20 * 8 + 0xf & 0xfffffffffffffff0));
      local_a0 = pdVar9;
      local_60 = pdVar9;
    }
    else {
      local_60 = (LhsScalar *)malloc(uVar20 * 8);
      local_a0 = local_60;
      if (local_60 == (LhsScalar *)0x0) goto LAB_0010fa65;
    }
  }
  else {
    local_a0 = (LhsScalar *)0x0;
    pdVar9 = &dStack_1a8;
  }
  uVar19 = local_50 * (long)local_70;
  if (0x1fffffffffffffff < uVar19) {
    pdVar9[-1] = 5.49763148293868e-318;
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = operator_delete;
    pdVar9[-1] = 5.49780934657118e-318;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a8 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar19 < 0x4001) {
      pdVar9 = (double *)((long)pdVar9 - (uVar19 * 8 + 0xf & 0xfffffffffffffff0));
      local_98 = pdVar9;
      local_a8 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.48839739601791e-318;
      local_a8 = (RhsScalar *)malloc(uVar19 * 8);
      local_98 = local_a8;
      if (local_a8 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.49811072661514e-318;
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = operator_delete;
        pdVar9[-1] = 5.49828859024765e-318;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_98 = (RhsScalar *)0x0;
  }
  if ((local_50 & 0x1c00000000000000) != 0) {
    pdVar9[-1] = 5.49785875313576e-318;
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = operator_delete;
    pdVar9[-1] = 5.49803661676827e-318;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __size = local_50 * 0x40;
  local_b0 = blocking->m_blockW;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    if (__size < 0x20001) {
      pdVar9 = pdVar9 + local_50 * -8;
      bVar21 = false;
      local_90 = pdVar9;
      local_b0 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.48913355383021e-318;
      local_90 = (RhsScalar *)malloc(__size);
      if (local_90 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.49833799681223e-318;
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = operator_delete;
        pdVar9[-1] = (double)&LAB_0010fb50;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      bVar21 = true;
      local_b0 = local_90;
    }
  }
  else {
    bVar21 = 0x20000 < __size;
    local_90 = (RhsScalar *)0x0;
  }
  local_110 = uVar20;
  local_108 = uVar19;
  if (manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize == 0) {
    local_fc = -1;
    pdVar9[-1] = 5.48954362831626e-318;
    queryCacheSizes(&local_fc,(int *)&local_88,(int *)&local_84);
    iVar8 = 0x2000;
    if (0 < local_fc) {
      iVar8 = local_fc;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize = (long)iVar8;
    local_88 = 0xffffffff;
    local_84 = 0xffffffff;
    pdVar9[-1] = 5.48981042376501e-318;
    queryCacheSizes(&local_fc,(int *)&local_88,(int *)&local_84);
    uVar3 = local_84;
    if ((int)local_84 < (int)local_88) {
      uVar3 = local_88;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = 0x100000;
    if (0 < (int)uVar3) {
      manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = (ulong)uVar3;
    }
  }
  if ((long)local_70 < 1) {
    local_c0 = 0;
  }
  else {
    uVar20 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize /
             (ulong)(otherStride << 5);
    local_c0 = uVar20 + 3;
    if (-1 < (long)uVar20) {
      local_c0 = uVar20;
    }
    local_c0 = local_c0 & 0xfffffffffffffffc;
  }
  if ((long)local_c0 < 5) {
    local_c0 = 4;
  }
  if (0 < (long)local_58) {
    local_118 = _other + 1;
    local_170 = local_50 * 8;
    local_180 = otherStride * local_c0 * 8;
    local_140 = local_148 + 1;
    local_1a0 = local_d8 * 8 + 8;
    local_168 = local_50 * local_1a0;
    local_190 = local_d8 * 0x20 + 0x20;
    local_130 = _other + local_50;
    local_188 = local_c8 * 8;
    local_128 = local_58 - local_50;
    local_120 = local_148 + local_50;
    local_78 = 0;
    local_138 = local_58;
    do {
      local_178 = local_138;
      if ((long)local_50 < (long)local_138) {
        local_178 = local_50;
      }
      uVar20 = local_58 - local_78;
      if ((long)local_50 < (long)(local_58 - local_78)) {
        uVar20 = local_50;
      }
      _l2 = uVar20;
      if (0 < (long)local_70) {
        local_d0 = local_118;
        lVar15 = 0;
        do {
          cols = lVar15;
          local_b8 = (long)local_70 - lVar15;
          uVar19 = local_b8;
          if ((long)local_c0 < (long)local_b8) {
            uVar19 = local_c0;
          }
          local_e0 = uVar19;
          if (0 < (long)uVar20) {
            local_160 = local_a8 + lVar15 * uVar20;
            local_158 = _other + lVar15 * otherStride;
            local_f0 = local_140;
            local_150 = local_d0;
            lVar14 = 0;
            uVar12 = local_178;
            do {
              cols_00 = local_e0;
              pRVar4 = local_160;
              local_198 = uVar12;
              uVar6 = 4;
              if ((long)uVar12 < 4) {
                uVar6 = uVar12;
              }
              if ((long)uVar6 < 2) {
                uVar6 = 1;
              }
              local_e8 = uVar20 - lVar14;
              lVar10 = 4;
              if (local_e8 < 4) {
                lVar10 = local_e8;
              }
              pdStack_40 = (double *)lVar10;
              lStack_f8 = lVar14;
              lVar1 = lVar14 + local_78;
              if (0 < local_e8) {
                uVar20 = 0;
                pdVar11 = local_f0;
                pdVar13 = local_150;
                do {
                  if (0 < (long)local_b8) {
                    pdVar16 = pdVar13;
                    lVar17 = cols;
                    do {
                      if (0 < (long)(~uVar20 + lVar10)) {
                        dVar2 = _other[lVar17 * otherStride + lVar1 + uVar20];
                        lVar18 = 0;
                        do {
                          pdVar16[lVar18] = pdVar11[lVar18] * -dVar2 + pdVar16[lVar18];
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < (long)(~uVar20 + lVar10));
                      }
                      lVar17 = lVar17 + 1;
                      pdVar16 = pdVar16 + otherStride;
                    } while (lVar17 < (long)(uVar19 + lVar15));
                  }
                  uVar20 = uVar20 + 1;
                  pdVar13 = pdVar13 + 1;
                  pdVar11 = (double *)((long)pdVar11 + local_1a0);
                } while (uVar20 != uVar6);
              }
              pdVar11 = local_158 + lVar1;
              pdVar9[-1] = (double)lVar14;
              pdVar9[-2] = (double)_l2;
              pdVar9[-3] = 5.49368389842841e-318;
              gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                        (&local_41,pRVar4,pdVar11,otherStride,lVar10,cols_00,(long)pdVar9[-2],
                         (long)pdVar9[-1]);
              lVar10 = (long)pdStack_40;
              lVar14 = local_d8;
              lVar17 = local_e8 - (long)pdStack_40;
              if (lVar17 != 0 && (long)pdStack_40 <= local_e8) {
                local_e8 = (long)pdStack_40 + lVar1;
                pdVar11 = local_148 + lVar1 * local_d8 + (long)pdStack_40 + lVar1;
                pdVar9[-2] = 0.0;
                pdVar9[-1] = 0.0;
                pLVar5 = local_60;
                pdVar9[-3] = 5.49412855750966e-318;
                gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                          (local_31,pLVar5,pdVar11,lVar14,lVar10,lVar17,(long)pdVar9[-2],
                           (long)pdVar9[-1]);
                lVar14 = (long)pdStack_40;
                pLVar5 = local_60;
                pRVar4 = local_160;
                res = local_158 + local_e8;
                pdVar9[-2] = (double)local_b0;
                pdVar9[-3] = (double)lStack_f8;
                pdVar9[-4] = 0.0;
                pdVar9[-5] = (double)_l2;
                pdVar9[-6] = (double)lVar14;
                pdVar9[-7] = (double)local_e0;
                pdVar9[-8] = (double)lVar14;
                pdVar9[-9] = 5.49457815724738e-318;
                gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                          (&local_32,res,otherStride,pLVar5,pRVar4,lVar17,(long)pdVar9[-8],
                           (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                           (long)pdVar9[-3],(double *)pdVar9[-2]);
              }
              lVar14 = lStack_f8 + 4;
              uVar12 = local_198 - 4;
              local_150 = local_150 + 4;
              local_f0 = (double *)((long)local_f0 + local_190);
              uVar20 = _l2;
            } while (lVar14 < (long)_l2);
          }
          lVar15 = cols + local_c0;
          local_d0 = (double *)((long)local_d0 + local_180);
        } while (lVar15 < (long)local_70);
      }
      lVar15 = local_78 + local_50;
      pdStack_40 = local_120;
      local_b8 = local_128;
      cols = (long)local_130;
      local_78 = lVar15;
      if ((long)local_58 <= lVar15) break;
      do {
        uVar20 = local_b8;
        local_b8 = local_b8 - local_c8;
        if (local_c8 <= (long)uVar20) {
          uVar20 = local_c8;
        }
        if (0 < (long)uVar20) {
          pdVar9[-2] = 0.0;
          pdVar9[-1] = 0.0;
          pdVar11 = pdStack_40;
          pLVar5 = local_60;
          uVar19 = _l2;
          lVar14 = local_d8;
          pdVar9[-3] = 5.49586766858302e-318;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (local_31,pLVar5,pdVar11,lVar14,uVar19,uVar20,(long)pdVar9[-2],(long)pdVar9[-1])
          ;
          uVar19 = _l2;
          pdVar9[-2] = (double)local_b0;
          pdVar9[-4] = 0.0;
          pdVar9[-3] = 0.0;
          pdVar9[-5] = -NAN;
          pdVar9[-6] = -NAN;
          pdVar9[-7] = local_70;
          pdVar9[-8] = (double)uVar19;
          pLVar5 = local_60;
          lVar14 = cols;
          pRVar4 = local_a8;
          pdVar9[-9] = 5.49637161554178e-318;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,(ResScalar *)lVar14,otherStride,pLVar5,pRVar4,uVar20,(long)pdVar9[-8]
                     ,(long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                     (long)pdVar9[-3],(double *)pdVar9[-2]);
        }
        lVar15 = lVar15 + local_c8;
        cols = cols + local_188;
        pdStack_40 = (double *)((long)pdStack_40 + local_188);
      } while (lVar15 < (long)local_58);
      local_138 = local_138 - local_50;
      local_118 = (double *)((long)local_118 + local_170);
      local_140 = (double *)((long)local_140 + local_168);
      local_130 = (double *)((long)local_130 + local_170);
      local_128 = local_128 - local_50;
      local_120 = (double *)((long)local_120 + local_168);
    } while (local_78 < (long)local_58);
  }
  pRVar4 = local_90;
  if (bVar21) {
    pdVar9[-1] = 5.49701884153783e-318;
    free(pRVar4);
  }
  pRVar4 = local_98;
  uVar20 = local_110;
  if (0x4000 < local_108) {
    pdVar9[-1] = 5.4971769425445e-318;
    free(pRVar4);
  }
  pLVar5 = local_a0;
  if (0x4000 < uVar20) {
    pdVar9[-1] = 5.49728069633013e-318;
    free(pLVar5);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * otherStride) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index s  = IsLower ? k2+k1 : i+1;
            Index rs = actualPanelWidth - k - 1; // remaining size

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Index s = IsLower ? i+1 : i-rs;
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }